

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comm_fwd.hpp
# Opt level: O0

future<std::vector<int,_std::allocator<int>_>_> * __thiscall
mxx::comm::irecv_vec<int,std::allocator<int>>
          (future<std::vector<int,_std::allocator<int>_>_> *__return_storage_ptr__,comm *this,
          size_t size,int src,int tag)

{
  MPI_Comm poVar1;
  int iVar2;
  int iVar3;
  value_type *pvVar4;
  reference pvVar5;
  MPI_Datatype poVar6;
  MPI_Request *ppoVar7;
  datatype local_c0;
  undefined1 local_a8 [8];
  datatype dt_1;
  datatype dt;
  undefined1 local_68 [8];
  future_builder<std::vector<int,_std::allocator<int>_>_> f;
  int tag_local;
  int src_local;
  size_t size_local;
  comm *this_local;
  
  f.m_future.m_data._M_t.
  super___uniq_ptr_impl<std::vector<int,_std::allocator<int>_>,_std::default_delete<std::vector<int,_std::allocator<int>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::vector<int,_std::allocator<int>_>_*,_std::default_delete<std::vector<int,_std::allocator<int>_>_>_>
  .super__Head_base<0UL,_std::vector<int,_std::allocator<int>_>_*,_false>._M_head_impl._0_4_ = tag;
  f.m_future.m_data._M_t.
  super___uniq_ptr_impl<std::vector<int,_std::allocator<int>_>,_std::default_delete<std::vector<int,_std::allocator<int>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::vector<int,_std::allocator<int>_>_*,_std::default_delete<std::vector<int,_std::allocator<int>_>_>_>
  .super__Head_base<0UL,_std::vector<int,_std::allocator<int>_>_*,_false>._M_head_impl._4_4_ = src;
  if (-1 < src) {
    iVar3 = comm::size(this);
    if (src < iVar3) goto LAB_001ee861;
  }
  assert_fail("0 <= src && src < this->size()",
              "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/include/mxx/comm_fwd.hpp"
              ,0x252,"irecv_vec");
LAB_001ee861:
  future_builder<std::vector<int,_std::allocator<int>_>_>::future_builder
            ((future_builder<std::vector<int,_std::allocator<int>_>_> *)local_68);
  pvVar4 = future_builder<std::vector<int,_std::allocator<int>_>_>::data
                     ((future_builder<std::vector<int,_std::allocator<int>_>_> *)local_68);
  std::vector<int,_std::allocator<int>_>::resize(pvVar4,size);
  if (size < 0x7fffffff) {
    get_datatype<int>();
    pvVar4 = future_builder<std::vector<int,_std::allocator<int>_>_>::data
                       ((future_builder<std::vector<int,_std::allocator<int>_>_> *)local_68);
    pvVar5 = std::vector<int,_std::allocator<int>_>::front(pvVar4);
    poVar6 = mxx::datatype::type((datatype *)&dt_1.builtin);
    iVar2 = f.m_future.m_data._M_t.
            super___uniq_ptr_impl<std::vector<int,_std::allocator<int>_>,_std::default_delete<std::vector<int,_std::allocator<int>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::vector<int,_std::allocator<int>_>_*,_std::default_delete<std::vector<int,_std::allocator<int>_>_>_>
            .super__Head_base<0UL,_std::vector<int,_std::allocator<int>_>_*,_false>._M_head_impl.
            _4_4_;
    iVar3 = (int)f.m_future.m_data._M_t.
                 super___uniq_ptr_impl<std::vector<int,_std::allocator<int>_>,_std::default_delete<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_std::vector<int,_std::allocator<int>_>_*,_std::default_delete<std::vector<int,_std::allocator<int>_>_>_>
                 .super__Head_base<0UL,_std::vector<int,_std::allocator<int>_>_*,_false>.
                 _M_head_impl;
    poVar1 = this->mpi_comm;
    ppoVar7 = future_builder<std::vector<int,_std::allocator<int>_>_>::add_request
                        ((future_builder<std::vector<int,_std::allocator<int>_>_> *)local_68);
    MPI_Irecv(pvVar5,size & 0xffffffff,poVar6,iVar2,iVar3,poVar1,ppoVar7);
    mxx::datatype::~datatype((datatype *)&dt_1.builtin);
  }
  else {
    get_datatype<int>();
    mxx::datatype::contiguous((datatype *)local_a8,&local_c0,size);
    mxx::datatype::~datatype(&local_c0);
    pvVar4 = future_builder<std::vector<int,_std::allocator<int>_>_>::data
                       ((future_builder<std::vector<int,_std::allocator<int>_>_> *)local_68);
    pvVar5 = std::vector<int,_std::allocator<int>_>::front(pvVar4);
    poVar6 = mxx::datatype::type((datatype *)local_a8);
    iVar2 = f.m_future.m_data._M_t.
            super___uniq_ptr_impl<std::vector<int,_std::allocator<int>_>,_std::default_delete<std::vector<int,_std::allocator<int>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::vector<int,_std::allocator<int>_>_*,_std::default_delete<std::vector<int,_std::allocator<int>_>_>_>
            .super__Head_base<0UL,_std::vector<int,_std::allocator<int>_>_*,_false>._M_head_impl.
            _4_4_;
    iVar3 = (int)f.m_future.m_data._M_t.
                 super___uniq_ptr_impl<std::vector<int,_std::allocator<int>_>,_std::default_delete<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_std::vector<int,_std::allocator<int>_>_*,_std::default_delete<std::vector<int,_std::allocator<int>_>_>_>
                 .super__Head_base<0UL,_std::vector<int,_std::allocator<int>_>_*,_false>.
                 _M_head_impl;
    poVar1 = this->mpi_comm;
    ppoVar7 = future_builder<std::vector<int,_std::allocator<int>_>_>::add_request
                        ((future_builder<std::vector<int,_std::allocator<int>_>_> *)local_68);
    MPI_Irecv(pvVar5,1,poVar6,iVar2,iVar3,poVar1,ppoVar7);
    mxx::datatype::~datatype((datatype *)local_a8);
  }
  future_builder<std::vector<int,_std::allocator<int>_>_>::get_future
            (__return_storage_ptr__,
             (future_builder<std::vector<int,_std::allocator<int>_>_> *)local_68);
  future_builder<std::vector<int,_std::allocator<int>_>_>::~future_builder
            ((future_builder<std::vector<int,_std::allocator<int>_>_> *)local_68);
  return __return_storage_ptr__;
}

Assistant:

inline mxx::future<std::vector<T, Alloc> > comm::irecv_vec(size_t size, int src, int tag) const {
    MXX_ASSERT(0 <= src && src < this->size());
    mxx::future_builder<std::vector<T, Alloc> > f;
    f.data()->resize(size);
    if (size < mxx::max_int) {
        mxx::datatype dt = mxx::get_datatype<T>();
        MPI_Irecv(&(f.data()->front()), size, dt.type(), src, tag, this->mpi_comm, &f.add_request());
    } else {
        mxx::datatype dt = mxx::get_datatype<T>().contiguous(size);
        MPI_Irecv(&(f.data()->front()), 1, dt.type(), src, tag, this->mpi_comm, &f.add_request());
    }
    return f.get_future();
}